

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O0

ion_err_t lfb_delete_all(ion_lfb_t *bag,ion_file_offset_t offset,ion_result_count_t *count)

{
  ion_err_t iVar1;
  ion_result_count_t *local_38;
  ion_file_offset_t next;
  ion_result_count_t *piStack_28;
  ion_err_t error;
  ion_result_count_t *count_local;
  ion_file_offset_t offset_local;
  ion_lfb_t *bag_local;
  
  piStack_28 = count;
  count_local = (ion_result_count_t *)offset;
  offset_local = (ion_file_offset_t)bag;
  while( true ) {
    if (count_local == (ion_result_count_t *)0xffffffffffffffff) {
      return '\0';
    }
    next._7_1_ = ion_fread_at(*(ion_file_handle_t *)offset_local,(ion_file_offset_t)count_local,8,
                              (ion_byte_t *)&local_38);
    if (next._7_1_ != '\0') break;
    iVar1 = lfb_delete((ion_lfb_t *)offset_local,(ion_file_offset_t)count_local);
    if (iVar1 != '\0') {
      return iVar1;
    }
    if (piStack_28 != (int *)0x0) {
      *piStack_28 = *piStack_28 + 1;
    }
    count_local = local_38;
    next._7_1_ = 0;
  }
  return next._7_1_;
}

Assistant:

ion_err_t
lfb_delete_all(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	ion_result_count_t	*count
) {
	ion_err_t			error;
	ion_file_offset_t	next;

	while (ION_LFB_NULL != offset) {
		error = ion_fread_at(bag->file_handle, offset, sizeof(ion_file_offset_t), (ion_byte_t *) &next);

		if (err_ok != error) {
			return error;
		}

		error = lfb_delete(bag, offset);

		if (err_ok != error) {
			return error;
		}

		if (NULL != count) {
			(*count)++;
		}

		offset = next;
	}

	return err_ok;
}